

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtop(fitsfile *mfptr,int grpid,fitsfile **gfptr,int *status)

{
  int iVar1;
  int *in_RCX;
  long *in_RDX;
  uint in_ESI;
  char *url [2];
  char comment [73];
  char location2 [1025];
  char location1 [1025];
  char location [1025];
  char *tkeyvalue;
  char keyvalue [1025];
  char keyword [75];
  long grpExtver;
  long ngroups;
  int found;
  int i;
  int *in_stack_ffffffffffffeeb8;
  int mode;
  int *piVar2;
  undefined7 in_stack_ffffffffffffeec0;
  byte in_stack_ffffffffffffeec7;
  fitsfile *in_stack_ffffffffffffeec8;
  int in_stack_ffffffffffffeed0;
  undefined1 *puVar3;
  char *in_stack_ffffffffffffeed8;
  int *in_stack_ffffffffffffeef8;
  char *in_stack_ffffffffffffef00;
  long *in_stack_ffffffffffffef08;
  char *in_stack_ffffffffffffef10;
  fitsfile *in_stack_ffffffffffffef18;
  int *in_stack_ffffffffffffef28;
  int in_stack_ffffffffffffef34;
  char *in_stack_ffffffffffffef38;
  int in_stack_ffffffffffffef44;
  fitsfile *in_stack_ffffffffffffef48;
  int *in_stack_ffffffffffffefc8;
  char *in_stack_ffffffffffffefd0;
  char **in_stack_ffffffffffffefd8;
  char *in_stack_ffffffffffffefe0;
  fitsfile *in_stack_ffffffffffffefe8;
  int *in_stack_fffffffffffff048;
  long *in_stack_fffffffffffff050;
  fitsfile *in_stack_fffffffffffff058;
  int *in_stack_fffffffffffff2c8;
  char *in_stack_fffffffffffff2d0;
  char *in_stack_fffffffffffff2d8;
  int *in_stack_fffffffffffff2e0;
  char *in_stack_fffffffffffff2e8;
  char *in_stack_fffffffffffff2f0;
  char *in_stack_fffffffffffff2f8;
  fitsfile local_cc8 [65];
  char local_8b8 [1032];
  char *local_4b0;
  char local_4a8 [1040];
  char local_98 [88];
  long local_40;
  long local_38;
  int local_30;
  int local_2c;
  int *local_28;
  long *local_20;
  uint local_14;
  int local_4;
  
  local_38 = 0;
  local_40 = 0;
  if (*in_RCX == 0) {
    *in_RDX = 0;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_14 = in_ESI;
    iVar1 = ffgmng(in_stack_fffffffffffff058,in_stack_fffffffffffff050,in_stack_fffffffffffff048);
    *local_28 = iVar1;
    if (local_38 < (int)local_14) {
      *local_28 = 0x158;
      snprintf(&stack0xffffffffffffeed8,0x49,
               "GRPID index %d larger total GRPID keywords %ld (ffgtop)",(ulong)local_14,local_38);
      ffpmsg((char *)0x1cbf9c);
    }
    else {
      snprintf(local_98,0x4b,"GRPID%d",(ulong)local_14);
      iVar1 = ffgkyj(in_stack_ffffffffffffef18,in_stack_ffffffffffffef10,in_stack_ffffffffffffef08,
                     in_stack_ffffffffffffef00,in_stack_ffffffffffffeef8);
      *local_28 = iVar1;
      if (*local_28 == 0) {
        if (local_40 < 1) {
          if (local_40 == 0) {
            *local_28 = 0x158;
            snprintf(&stack0xffffffffffffeed8,0x49,"Invalid value of %ld for GRPID%d (ffgtop)",0,
                     (ulong)local_14);
            ffpmsg((char *)0x1cc091);
          }
          else {
            local_40 = -local_40;
            snprintf(local_98,0x4b,"GRPLC%d",(ulong)local_14);
            mode = (int)((ulong)in_stack_ffffffffffffeeb8 >> 0x20);
            iVar1 = ffgkls(in_stack_ffffffffffffefe8,in_stack_ffffffffffffefe0,
                           in_stack_ffffffffffffefd8,in_stack_ffffffffffffefd0,
                           in_stack_ffffffffffffefc8);
            *local_28 = iVar1;
            if (*local_28 == 0) {
              strcpy(local_4a8,local_4b0);
              free(local_4b0);
            }
            if (*local_28 == 0xca) {
              *local_28 = 0x158;
              snprintf(&stack0xffffffffffffeed8,0x49,"Cannot find GRPLC%d keyword (ffgtop)",
                       (ulong)local_14);
              ffpmsg((char *)0x1cc178);
            }
            else {
              prepare_keyvalue((char *)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0)
                              );
              iVar1 = fits_is_url_absolute(in_stack_ffffffffffffeed8);
              if (iVar1 == 0) {
                iVar1 = fits_url2path(in_stack_fffffffffffff2d8,in_stack_fffffffffffff2d0,
                                      in_stack_fffffffffffff2c8);
                *local_28 = iVar1;
                iVar1 = ffopentest(in_stack_ffffffffffffeed0,(fitsfile **)in_stack_ffffffffffffeec8,
                                   (char *)CONCAT17(in_stack_ffffffffffffeec7,
                                                    in_stack_ffffffffffffeec0),mode,(int *)0x1cc290)
                ;
                *local_28 = iVar1;
                if (*local_28 != 0) {
                  ffpmsg((char *)0x1cc2ba);
                  *local_28 = 0;
                  iVar1 = ffopentest(in_stack_ffffffffffffeed0,
                                     (fitsfile **)in_stack_ffffffffffffeec8,
                                     (char *)CONCAT17(in_stack_ffffffffffffeec7,
                                                      in_stack_ffffffffffffeec0),mode,
                                     (int *)0x1cc2ec);
                  *local_28 = iVar1;
                  if (*local_28 != 0) {
                    *local_28 = 0;
                    in_stack_ffffffffffffeec8 = local_cc8;
                    puVar3 = &stack0xffffffffffffef28;
                    piVar2 = local_28;
                    iVar1 = fits_get_url((fitsfile *)location1._728_8_,(char *)location1._720_8_,
                                         (char *)location1._712_8_,(char *)location1._704_8_,
                                         (char *)location1._696_8_,(int *)location1._688_8_,
                                         (int *)location1._752_8_);
                    *local_28 = iVar1;
                    local_2c = 0;
                    local_30 = 0;
                    *local_20 = 0;
                    while( true ) {
                      in_stack_ffffffffffffeec7 = 0;
                      if (local_2c < 2) {
                        in_stack_ffffffffffffeec7 = local_30 != 0 ^ 0xff;
                      }
                      if ((in_stack_ffffffffffffeec7 & 1) == 0) break;
                      if (**(char **)(&stack0xffffffffffffeec8 + (long)local_2c * 8) != '\0') {
                        iVar1 = fits_relurl2url(in_stack_fffffffffffff2f8,in_stack_fffffffffffff2f0,
                                                in_stack_fffffffffffff2e8,in_stack_fffffffffffff2e0)
                        ;
                        *local_28 = iVar1;
                        if (*local_28 == 0) {
                          iVar1 = fits_is_url_absolute(in_stack_ffffffffffffeed8);
                          if (iVar1 == 0) {
                            iVar1 = fits_url2path(in_stack_fffffffffffff2d8,
                                                  in_stack_fffffffffffff2d0,
                                                  in_stack_fffffffffffff2c8);
                            *local_28 = iVar1;
                            strcpy(local_8b8,
                                   *(char **)(&stack0xffffffffffffeec8 + (long)local_2c * 8));
                          }
                          iVar1 = ffopentest((int)puVar3,(fitsfile **)in_stack_ffffffffffffeec8,
                                             (char *)CONCAT17(in_stack_ffffffffffffeec7,
                                                              in_stack_ffffffffffffeec0),
                                             (int)((ulong)piVar2 >> 0x20),(int *)0x1cc4ad);
                          *local_28 = iVar1;
                          if (*local_28 != 0) {
                            ffpmsg((char *)0x1cc4d2);
                            ffpmsg((char *)0x1cc4de);
                            *local_28 = 0;
                            iVar1 = ffopentest((int)puVar3,(fitsfile **)in_stack_ffffffffffffeec8,
                                               (char *)CONCAT17(in_stack_ffffffffffffeec7,
                                                                in_stack_ffffffffffffeec0),
                                               (int)((ulong)piVar2 >> 0x20),(int *)0x1cc510);
                            *local_28 = iVar1;
                          }
                          if (*local_28 == 0) {
                            local_30 = 1;
                          }
                          else {
                            *local_28 = 0;
                          }
                        }
                        else {
                          *local_28 = 0;
                        }
                      }
                      local_2c = local_2c + 1;
                    }
                  }
                }
              }
              else {
                ffpmsg((char *)0x1cc1ac);
                iVar1 = ffopentest(in_stack_ffffffffffffeed0,(fitsfile **)in_stack_ffffffffffffeec8,
                                   (char *)CONCAT17(in_stack_ffffffffffffeec7,
                                                    in_stack_ffffffffffffeec0),mode,(int *)0x1cc1d3)
                ;
                *local_28 = iVar1;
                if (*local_28 != 0) {
                  ffpmsg((char *)0x1cc1fd);
                  *local_28 = 0;
                  iVar1 = ffopentest(in_stack_ffffffffffffeed0,
                                     (fitsfile **)in_stack_ffffffffffffeec8,
                                     (char *)CONCAT17(in_stack_ffffffffffffeec7,
                                                      in_stack_ffffffffffffeec0),mode,
                                     (int *)0x1cc22f);
                  *local_28 = iVar1;
                }
              }
            }
          }
        }
        else {
          iVar1 = ffreopen(in_stack_ffffffffffffeec8,
                           (fitsfile **)
                           CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0),
                           in_stack_ffffffffffffeeb8);
          *local_28 = iVar1;
        }
        if (*local_28 == 0) {
          if (*local_20 == 0) {
            ffpmsg((char *)0x1cc58a);
            *local_28 = 0x157;
          }
          else {
            iVar1 = ffmnhd(in_stack_ffffffffffffef48,in_stack_ffffffffffffef44,
                           in_stack_ffffffffffffef38,in_stack_ffffffffffffef34,
                           in_stack_ffffffffffffef28);
            *local_28 = iVar1;
            if (*local_28 != 0) {
              *local_28 = 0x157;
            }
          }
        }
      }
    }
    if ((*local_28 != 0) && (*local_20 != 0)) {
      ffclos(in_stack_ffffffffffffeec8,
             (int *)CONCAT17(in_stack_ffffffffffffeec7,in_stack_ffffffffffffeec0));
      *local_20 = 0;
    }
    local_4 = *local_28;
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffgtop(fitsfile *mfptr,  /* FITS file pointer to the member HDU          */
	   int       grpid,  /* group ID (GRPIDn index) within member HDU    */
	   fitsfile **gfptr, /* FITS file pointer to grouping table HDU      */
	   int      *status) /* return status code                           */

/*
  open the grouping table that contains the member HDU. The member HDU must
  be the CHDU of the FITS file pointed to by mfptr, and the grouping table
  is identified by the Nth index number of the GRPIDn keywords specified in 
  the member HDU's header. The fitsfile gfptr pointer is positioned with the
  appropriate FITS file with the grouping table as the CHDU. If the group
  grouping table resides in a file other than the member then an attempt
  is first made to open the file readwrite, and failing that readonly.
 
  Note that it is possible for the GRPIDn/GRPLCn keywords in a member 
  header to be non-continuous, e.g., GRPID1, GRPID2, GRPID5, GRPID6. In 
  such cases, the grpid index value specified in the function call shall
  identify the (grpid)th GRPID value. In the above example, if grpid == 3,
  then the group specified by GRPID5 would be opened.
*/
{
  int i;
  int found;

  long ngroups   = 0;
  long grpExtver = 0;

  char keyword[FLEN_KEYWORD];
  char keyvalue[FLEN_FILENAME];
  char *tkeyvalue;
  char location[FLEN_FILENAME];
  char location1[FLEN_FILENAME];
  char location2[FLEN_FILENAME];
  char comment[FLEN_COMMENT];

  char *url[2];


  if(*status != 0) return(*status);

  do
    {
      /* set the grouping table pointer to NULL for error checking later */

      *gfptr = NULL;

      /*
	make sure that the group ID requested is valid ==> cannot be
	larger than the number of GRPIDn keywords in the member HDU header
      */

      *status = fits_get_num_groups(mfptr,&ngroups,status);

      if(grpid > ngroups)
	{
	  *status = BAD_GROUP_ID;
	  snprintf(comment,FLEN_COMMENT,
		  "GRPID index %d larger total GRPID keywords %ld (ffgtop)",
		  grpid,ngroups);
	  ffpmsg(comment);
	  continue;
	}

      /*
	find the (grpid)th group that the member HDU belongs to and read
	the value of the GRPID(grpid) keyword; fits_get_num_groups()
	automatically re-enumerates the GRPIDn/GRPLCn keywords to fill in
	any gaps
      */

      snprintf(keyword,FLEN_KEYWORD,"GRPID%d",grpid);

      *status = fits_read_key_lng(mfptr,keyword,&grpExtver,comment,status);

      if(*status != 0) continue;

      /*
	if the value of the GRPIDn keyword is positive then the member is
	in the same FITS file as the grouping table and we only have to
	reopen the current FITS file. Else the member and grouping table
	HDUs reside in different files and another FITS file must be opened
	as specified by the corresponding GRPLCn keyword
	
	The DO WHILE loop only executes once and is used to control the
	file opening logic.
      */

      do
	{
	  if(grpExtver > 0) 
	    {
	      /*
		the member resides in the same file as the grouping
		 table, so just reopen the grouping table file
	      */

	      *status = fits_reopen_file(mfptr,gfptr,status);
	      continue;
	    }

	  else if(grpExtver == 0)
	    {
	      /* a GRPIDn value of zero (0) is undefined */

	      *status = BAD_GROUP_ID;
	      snprintf(comment,FLEN_COMMENT,"Invalid value of %ld for GRPID%d (ffgtop)",
		      grpExtver,grpid);
	      ffpmsg(comment);
	      continue;
	    }

	  /* 
	     The GRPLCn keyword value is negative, which implies that
	     the grouping table must reside in another FITS file;
	     search for the corresponding GRPLCn keyword 
	  */
	  
	  /* set the grpExtver value positive */
  
	  grpExtver = -1*grpExtver;

	  /* read the GRPLCn keyword value */

	  snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",grpid);
	  /* SPR 1738 */
	  *status = fits_read_key_longstr(mfptr,keyword,&tkeyvalue,comment,
				      status);
	  if (0 == *status) {
	    strcpy(keyvalue,tkeyvalue);
	    free(tkeyvalue);
	  }
	  

	  /* if the GRPLCn keyword was not found then there is a problem */

	  if(*status == KEY_NO_EXIST)
	    {
	      *status = BAD_GROUP_ID;

	      snprintf(comment,FLEN_COMMENT,"Cannot find GRPLC%d keyword (ffgtop)",
		      grpid);
	      ffpmsg(comment);

	      continue;
	    }

	  prepare_keyvalue(keyvalue);

	  /*
	    if the GRPLCn keyword value specifies an absolute URL then
	    try to open the file; we cannot attempt any relative URL
	    or host-dependent file path reconstruction
	  */

	  if(fits_is_url_absolute(keyvalue))
	    {
	      ffpmsg("Try to open group table file as absolute URL (ffgtop)");

	      *status = fits_open_file(gfptr,keyvalue,READWRITE,status);

	      /* if the open was successful then continue */

	      if(*status == 0) continue;

	      /* if READWRITE failed then try opening it READONLY */

	      ffpmsg("OK, try open group table file as READONLY (ffgtop)");
	      
	      *status = 0;
	      *status = fits_open_file(gfptr,keyvalue,READONLY,status);

	      /* continue regardless of the outcome */

	      continue;
	    }

	  /*
	    see if the URL gives a file path that is absolute on the
	    host machine 
	  */

	  *status = fits_url2path(keyvalue,location1,status);

	  *status = fits_open_file(gfptr,location1,READWRITE,status);

	  /* if the file opened then continue */

	  if(*status == 0) continue;

	  /* if READWRITE failed then try opening it READONLY */

	  ffpmsg("OK, try open group table file as READONLY (ffgtop)");
	  
	  *status = 0;
	  *status = fits_open_file(gfptr,location1,READONLY,status);

	  /* if the file opened then continue */

	  if(*status == 0) continue;

	  /*
	    the grouping table location given by GRPLCn must specify a 
	    relative URL. We assume that this URL is relative to the 
	    member HDU's FITS file. Try to construct a full URL location 
	    for the grouping table's FITS file and then open it
	  */

	  *status = 0;
		  
	  /* retrieve the URL information for the member HDU's file */
		  
	  url[0] = location1; url[1] = location2;
		  
	  *status = fits_get_url(mfptr,url[0],url[1],NULL,NULL,NULL,status);

	  /*
	    It is possible that the member HDU file has an initial
	    URL it was opened with and a real URL that the file actually
	    exists at (e.g., an HTTP accessed file copied to a local
	    file). For each possible URL try to construct a
	  */
		  
	  for(i = 0, found = 0, *gfptr = NULL; i < 2 && !found; ++i)
	    {
	      
	      /* the url string could be empty */
	      
	      if(*url[i] == 0) continue;
	      
	      /* 
		 create a full URL from the partial and the member
		 HDU file URL
	      */
	      
	      *status = fits_relurl2url(url[i],keyvalue,location,status);
	      
	      /* if an error occured then contniue */
	      
	      if(*status != 0) 
		{
		  *status = 0;
		  continue;
		}
	      
	      /*
		if the location does not specify an access method
		then turn it into a host dependent path
	      */

	      if(! fits_is_url_absolute(location))
		{
		  *status = fits_url2path(location,url[i],status);
		  strcpy(location,url[i]);
		}
	      
	      /* try to open the grouping table file READWRITE */
	      
	      *status = fits_open_file(gfptr,location,READWRITE,status);
	      
	      if(*status != 0)
		{    
		  /* try to open the grouping table file READONLY */
		  
		  ffpmsg("opening file as READWRITE failed (ffgtop)");
		  ffpmsg("OK, try to open file as READONLY (ffgtop)");
		  *status = 0;
		  *status = fits_open_file(gfptr,location,READONLY,status);
		}
	      
	      /* either set the found flag or reset the status flag */
	      
	      if(*status == 0) 
		found = 1;
	      else
		*status = 0;
	    }

	}while(0); /* end of file opening loop */

      /* if an error occured with the file opening then exit */

      if(*status != 0) continue;
  
      if(*gfptr == NULL)
	{
	  ffpmsg("Cannot open or find grouping table FITS file (ffgtop)");
	  *status = GROUP_NOT_FOUND;
	  continue;
	}

      /* search for the grouping table in its FITS file */

      *status = fits_movnam_hdu(*gfptr,ANY_HDU,"GROUPING",(int)grpExtver,
				status);

      if(*status != 0) *status = GROUP_NOT_FOUND;

    }while(0);

  if(*status != 0 && *gfptr != NULL) 
    {
      fits_close_file(*gfptr,status);
      *gfptr = NULL;
    }

  return(*status);
}